

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

EOPLL_RateConv * EOPLL_RateConv_new(double f_inp,double f_out,int ch)

{
  EOPLL_RateConv *pEVar1;
  int32_t **ppiVar2;
  int32_t *piVar3;
  int16_t *piVar4;
  double dVar5;
  double x;
  int i;
  EOPLL_RateConv *conv;
  int ch_local;
  double f_out_local;
  double f_inp_local;
  
  pEVar1 = (EOPLL_RateConv *)malloc(0x28);
  pEVar1->ch = ch;
  pEVar1->f_ratio = f_inp / f_out;
  ppiVar2 = (int32_t **)malloc((long)ch << 3);
  pEVar1->buf = ppiVar2;
  for (x._4_4_ = 0; x._4_4_ < ch; x._4_4_ = x._4_4_ + 1) {
    piVar3 = (int32_t *)malloc(0x40);
    pEVar1->buf[x._4_4_] = piVar3;
  }
  piVar4 = (int16_t *)malloc(0x1000);
  pEVar1->sinc_table = piVar4;
  for (x._4_4_ = 0; x._4_4_ < 0x800; x._4_4_ = x._4_4_ + 1) {
    if (f_inp <= f_out) {
      dVar5 = windowed_sinc((double)x._4_4_ / 256.0);
      pEVar1->sinc_table[x._4_4_] = (int16_t)(int)(dVar5 * 4096.0);
    }
    else {
      dVar5 = windowed_sinc(((double)x._4_4_ / 256.0) / pEVar1->f_ratio);
      pEVar1->sinc_table[x._4_4_] = (int16_t)(int)((dVar5 * 4096.0) / pEVar1->f_ratio);
    }
  }
  return pEVar1;
}

Assistant:

EOPLL_RateConv *EOPLL_RateConv_new(double f_inp, double f_out, int ch) {
  EOPLL_RateConv *conv = malloc(sizeof(EOPLL_RateConv));
  int i;

  conv->ch = ch;
  conv->f_ratio = f_inp / f_out;
  conv->buf = malloc(sizeof(void *) * ch);
  for (i = 0; i < ch; i++) {
    conv->buf[i] = malloc(sizeof(conv->buf[0][0]) * LW);
  }

  /* create sinc_table for positive 0 <= x < LW/2 */
  conv->sinc_table = malloc(sizeof(conv->sinc_table[0]) * SINC_RESO * LW / 2);
  for (i = 0; i < SINC_RESO * LW / 2; i++) {
    const double x = (double)i / SINC_RESO;
    if (f_out < f_inp) {
      /* for downsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x / conv->f_ratio) / conv->f_ratio);
    } else {
      /* for upsampling */
      conv->sinc_table[i] = (int16_t)((1 << SINC_AMP_BITS) * windowed_sinc(x));
    }
  }

  return conv;
}